

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::readCStyleComment(Reader *this)

{
  Char CVar1;
  Char c;
  Reader *this_local;
  
  do {
    if (this->end_ <= this->current_ + 1) break;
    CVar1 = getNextChar(this);
  } while ((CVar1 != '*') || (*this->current_ != '/'));
  CVar1 = getNextChar(this);
  return CVar1 == '/';
}

Assistant:

bool Reader::readCStyleComment() {
  while ((current_ + 1) < end_) {
    Char c = getNextChar();
    if (c == '*' && *current_ == '/')
      break;
  }
  return getNextChar() == '/';
}